

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scratch_impl.h
# Opt level: O0

secp256k1_scratch * secp256k1_scratch_create(secp256k1_callback *error_callback,size_t max_size)

{
  secp256k1_scratch *__s;
  secp256k1_callback *in_RSI;
  secp256k1_callback *in_RDI;
  secp256k1_scratch *ret;
  size_t in_stack_ffffffffffffffe8;
  
  __s = (secp256k1_scratch *)checked_malloc(in_RSI,in_stack_ffffffffffffffe8);
  if (__s != (secp256k1_scratch *)0x0) {
    memset(__s,0,0x90);
    __s->max_size = (size_t)in_RSI;
    __s->error_callback = in_RDI;
  }
  return __s;
}

Assistant:

static secp256k1_scratch* secp256k1_scratch_create(const secp256k1_callback* error_callback, size_t max_size) {
    secp256k1_scratch* ret = (secp256k1_scratch*)checked_malloc(error_callback, sizeof(*ret));
    if (ret != NULL) {
        memset(ret, 0, sizeof(*ret));
        ret->max_size = max_size;
        ret->error_callback = error_callback;
    }
    return ret;
}